

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quake.cpp
# Opt level: O0

double __thiscall DEarthquake::GetModIntensity(DEarthquake *this,double intensity,bool fake)

{
  bool bVar1;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_24;
  int local_20;
  int scalar;
  int divider;
  bool check;
  bool fake_local;
  double intensity_local;
  DEarthquake *this_local;
  
  if (this->m_CountdownStart < this->m_Countdown) {
    __assert_fail("m_CountdownStart >= m_Countdown",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_quake.cpp"
                  ,0xb0,"double DEarthquake::GetModIntensity(double, bool) const");
  }
  _divider = intensity + intensity;
  if ((this->m_Flags & 6U) != 0) {
    bVar1 = false;
    if (0 < this->m_Highpoint) {
      bVar1 = this->m_Highpoint < this->m_CountdownStart;
    }
    if (bVar1) {
      local_38 = this->m_Highpoint;
    }
    else {
      local_38 = this->m_CountdownStart;
    }
    local_20 = local_38;
    if ((this->m_Flags & 6U) == 6) {
      if (bVar1) {
        if (this->m_MiniCount < 1) {
          local_20 = this->m_CountdownStart - this->m_Highpoint;
          if ((this->m_Flags & 8U) == 0) {
            local_40 = this->m_Countdown;
          }
          else {
            local_40 = local_20 - this->m_Countdown;
          }
          local_24 = local_40;
        }
        else {
          if ((this->m_Flags & 8U) == 0) {
            local_3c = this->m_Highpoint - this->m_MiniCount;
          }
          else {
            local_3c = this->m_MiniCount;
          }
          local_24 = local_3c;
        }
      }
      else {
        local_20 = this->m_CountdownStart;
        if ((this->m_Flags & 8U) == 0) {
          local_44 = MIN<int>(this->m_Countdown,this->m_CountdownStart - this->m_Countdown);
        }
        else {
          local_44 = MAX<int>(this->m_Countdown,this->m_CountdownStart - this->m_Countdown);
        }
        local_24 = local_44;
      }
      if (local_20 < local_24) {
        local_48 = local_20;
      }
      else {
        local_48 = local_24;
      }
      local_24 = local_48;
      if ((!fake) && ((this->m_Flags & 0x10U) != 0)) {
        local_24 = local_48 << 1;
      }
    }
    else {
      if ((this->m_Flags & 2U) == 0) {
        local_24 = this->m_CountdownStart - this->m_Countdown;
        if (0 < this->m_Highpoint) {
          if (this->m_Highpoint - this->m_MiniCount < local_38) {
            local_24 = this->m_Highpoint - this->m_MiniCount;
          }
          else {
            local_24 = local_38;
          }
        }
      }
      else {
        local_24 = this->m_Countdown;
      }
      if (local_38 < local_24) {
        local_4c = local_38;
      }
      else {
        local_4c = local_24;
      }
      local_24 = local_4c;
    }
    if (local_20 < 1) {
      __assert_fail("divider > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_quake.cpp"
                    ,0xe8,"double DEarthquake::GetModIntensity(double, bool) const");
    }
    _divider = (_divider * (double)local_24) / (double)local_20;
  }
  return _divider;
}

Assistant:

double DEarthquake::GetModIntensity(double intensity, bool fake) const
{
	assert(m_CountdownStart >= m_Countdown);

	intensity += intensity;		// always doubled

	if (m_Flags & (QF_SCALEDOWN | QF_SCALEUP))
	{
		// Adjustable maximums must use a range between 1 and m_CountdownStart to constrain between no quake and full quake.
		bool check = !!(m_Highpoint > 0 && m_Highpoint < m_CountdownStart);
		int divider = (check) ? m_Highpoint : m_CountdownStart;
		int scalar;
		
		if ((m_Flags & (QF_SCALEDOWN | QF_SCALEUP)) == (QF_SCALEDOWN | QF_SCALEUP))
		{
			if (check)
			{
				if (m_MiniCount > 0)
					scalar = (m_Flags & QF_MAX) ? m_MiniCount : (m_Highpoint - m_MiniCount);
				else
				{
					divider = m_CountdownStart - m_Highpoint;
					scalar = (m_Flags & QF_MAX) ? (divider - m_Countdown) : m_Countdown;
				}
			}
			else
			{
				// Defaults to middle of the road.
				divider = m_CountdownStart;
				scalar = (m_Flags & QF_MAX) ? MAX(m_Countdown, m_CountdownStart - m_Countdown)
					: MIN(m_Countdown, m_CountdownStart - m_Countdown);
			}
			scalar = (scalar > divider) ? divider : scalar;

			if (!fake && (m_Flags & QF_FULLINTENSITY))
			{
				scalar *= 2;
			}
		}
		else 
		{
			if (m_Flags & QF_SCALEDOWN)
			{
				scalar = m_Countdown;
			}
			else			// QF_SCALEUP
			{ 
				scalar = m_CountdownStart - m_Countdown;
				if (m_Highpoint > 0)
				{
					if ((m_Highpoint - m_MiniCount) < divider)
						scalar = m_Highpoint - m_MiniCount;
					else
						scalar = divider;
				}
			}
			scalar = (scalar > divider) ? divider : scalar;			
		}		
		assert(divider > 0);
		intensity = intensity * scalar / divider;
	}
	return intensity;
}